

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_accessors_kernels.h
# Opt level: O0

P * ref_facexy(P *v,Dimensions dims,int nu,int noctant_per_block,int ix,int iy,int ie,int ia,int iu,
              int octant_in_block)

{
  int ie_local;
  int iy_local;
  int ix_local;
  int noctant_per_block_local;
  int nu_local;
  P *v_local;
  
  if (v == (P *)0x0) {
    __assert_fail("v",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                  ,0x1d8,
                  "P *ref_facexy(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                 );
  }
  if (nu < 1) {
    __assert_fail("nu > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                  ,0x1d9,
                  "P *ref_facexy(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                 );
  }
  if ((ix < 0) || (dims.ncell_x <= ix)) {
    __assert_fail("ix >= 0 && ix < dims.ncell_x",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                  ,0x1da,
                  "P *ref_facexy(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                 );
  }
  if ((iy < 0) || (dims.ncell_y <= iy)) {
    __assert_fail("iy >= 0 && iy < dims.ncell_y",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                  ,0x1db,
                  "P *ref_facexy(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                 );
  }
  if ((ie < 0) || (dims.ne <= ie)) {
    __assert_fail("ie >= 0 && ie < dims.ne",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                  ,0x1dc,
                  "P *ref_facexy(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                 );
  }
  if ((ia < 0) || (dims.na <= ia)) {
    __assert_fail("ia >= 0 && ia < dims.na",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                  ,0x1dd,
                  "P *ref_facexy(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                 );
  }
  if ((iu < 0) || (nu <= iu)) {
    __assert_fail("iu >= 0 && iu < nu",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                  ,0x1de,
                  "P *ref_facexy(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                 );
  }
  if ((-1 < octant_in_block) && (octant_in_block < noctant_per_block)) {
    return v + (ia + dims.na * (iu + nu * (ix + dims.ncell_x *
                                                (iy + dims.ncell_y *
                                                      (ie + dims.ne * octant_in_block)))));
  }
  __assert_fail("octant_in_block >= 0 && octant_in_block < noctant_per_block",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                ,0x1df,
                "P *ref_facexy(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
               );
}

Assistant:

TARGET_HD static inline P* ref_facexy(
    P* const __restrict__  v,
    const Dimensions       dims,
    const int              nu,
    const int              noctant_per_block,
    const int              ix,
    const int              iy,
    const int              ie,
    const int              ia,
    const int              iu,
    const int              octant_in_block )
{
  Assert( v );
  Assert( nu > 0 );
  Assert( ix >= 0 && ix < dims.ncell_x );
  Assert( iy >= 0 && iy < dims.ncell_y );
  Assert( ie >= 0 && ie < dims.ne );
  Assert( ia >= 0 && ia < dims.na );
  Assert( iu >= 0 && iu < nu );
  Assert( octant_in_block >= 0 && octant_in_block < noctant_per_block );

  return & v[ ia + dims.na      * (
              iu + nu           * (
              ix + dims.ncell_x * (
              iy + dims.ncell_y * (
              ie + dims.ne      * (
              octant_in_block ))))) ];
}